

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeList.h
# Opt level: O3

void __thiscall
Refal2::CHole::CHole(CHole *this,CUnitList *hole,TTableIndex _left,TTableIndex _right)

{
  CNodeType *pCVar1;
  
  (this->super_CUnitList).super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
  (this->super_CUnitList).super_CNodeList<Refal2::CUnit>.last = (CNodeType *)0x0;
  (this->super_CUnitList).super_CNodeList<Refal2::CUnit>._vptr_CNodeList =
       (_func_int **)&PTR__CNodeList_00148978;
  this->left = _left;
  this->right = _right;
  if ((CHole *)hole != this) {
    pCVar1 = (hole->super_CNodeList<Refal2::CUnit>).first;
    (hole->super_CNodeList<Refal2::CUnit>).first = (CNodeType *)0x0;
    (this->super_CUnitList).super_CNodeList<Refal2::CUnit>.first = pCVar1;
    pCVar1 = (hole->super_CNodeList<Refal2::CUnit>).last;
    (hole->super_CNodeList<Refal2::CUnit>).last =
         (this->super_CUnitList).super_CNodeList<Refal2::CUnit>.last;
    (this->super_CUnitList).super_CNodeList<Refal2::CUnit>.last = pCVar1;
  }
  return;
}

Assistant:

CNodeList() :
		first( nullptr ),
		last( nullptr )
	{
	}